

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::PrepareForIgnoringIntOverflow(GlobOpt *this,Instr *instr)

{
  ushort uVar1;
  Type TVar2;
  BasicBlock *pBVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  BOOLEAN BVar8;
  BOOLEAN BVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  Sym *this_00;
  Value *value;
  PropertySym *propertySym;
  FloatConstantValueInfo *pFVar14;
  StackSym *pSVar15;
  JITTimeFunctionBody *pJVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  ushort uVar19;
  OpCode opcode;
  uint uVar20;
  IntOverflowDoesNotMatterRange *pIVar21;
  Type_conflict pBVar22;
  BVUnitT<unsigned_long> local_f8;
  SparseBVUnit _unit;
  undefined1 auStack_98 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv2;
  undefined1 auStack_58 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv1;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x36d7,"(instr)","instr");
    if (!bVar6) goto LAB_00425319;
    *puVar13 = 0;
  }
  opcode = instr->m_opcode;
  uVar1 = *(ushort *)&instr->field_0x36;
  if ((uVar1 >> 8 & 1) != 0) {
    if ((this->field_0xf4 & 2) == 0) {
      uVar19 = 0x100;
    }
    else {
      bVar6 = OpCodeAttr::IsInt32(opcode);
      uVar19 = (ushort)bVar6 << 8;
      uVar1 = *(ushort *)&instr->field_0x36;
    }
    *(ushort *)&instr->field_0x36 = uVar19 | uVar1 & 0xfeff;
  }
  pIVar21 = this->intOverflowDoesNotMatterRange;
  if (pIVar21 == (IntOverflowDoesNotMatterRange *)0x0) {
    if ((this->field_0xf4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x36e4,"(intOverflowCurrentlyMattersInRange)",
                         "intOverflowCurrentlyMattersInRange");
      if (!bVar6) {
LAB_00425319:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar13 = 0;
    }
  }
  else if (pIVar21->lastInstr == instr) {
    if (opcode != NoIntOverflowBoundary) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x36ec,"(isBoundary)","isBoundary");
      if (!bVar6) goto LAB_00425319;
      *puVar13 = 0;
      pIVar21 = this->intOverflowDoesNotMatterRange;
    }
    this->field_0xf4 = this->field_0xf4 | 2;
    this->intOverflowDoesNotMatterRange = pIVar21->next;
  }
  else {
    uVar20 = *(uint *)&this->field_0xf4;
    if (((uVar20 & 2) != 0) && (pIVar21->firstInstr == instr)) {
      tempBv1.lastUsedNodePrevNextField._6_2_ = opcode;
      if (opcode == NoIntOverflowBoundary) {
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x36ff,"(isBoundary)","isBoundary");
        if (!bVar6) goto LAB_00425319;
        *puVar13 = 0;
        uVar20 = *(uint *)&this->field_0xf4;
        pIVar21 = this->intOverflowDoesNotMatterRange;
      }
      *(uint *)&this->field_0xf4 = uVar20 & 0xfffffffd;
      tempBv2.lastFoundIndex = (Type_conflict)this->tempAlloc;
      tempBv1.alloc = (Type)auStack_58;
      auStack_58 = (undefined1  [8])0x0;
      tempBv1.head = (Type_conflict)0x0;
      tempBv2.alloc = (Type)auStack_98;
      auStack_98 = (undefined1  [8])0x0;
      tempBv2.head = (Type_conflict)0x0;
      pBVar22 = (Type_conflict)&pIVar21->symsRequiredToBeInt;
      tempBv1.lastFoundIndex = tempBv2.lastFoundIndex;
      while (pBVar22 = pBVar22->next, pBVar22 != (Type_conflict)0x0) {
        TVar2 = pBVar22->startIndex;
        local_f8.word = (pBVar22->data).word;
        while (local_f8.word != 0) {
          lVar4 = 0;
          if (local_f8.word != 0) {
            for (; (local_f8.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear(&local_f8,(BVIndex)lVar4);
          uVar20 = (BVIndex)lVar4 + TVar2;
          this_00 = SymTable::Find(this->func->m_symTable,uVar20);
          if (this_00 == (Sym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3718,"(sym)","sym");
            if (!bVar6) goto LAB_00425319;
            *puVar13 = 0;
          }
          pBVar3 = this->currentBlock;
          if (this_00->m_kind == SymKindStack) {
            value = GlobOptBlockData::FindValue(&pBVar3->globOptData,this_00);
          }
          else {
            propertySym = Sym::AsPropertySym(this_00);
            value = GlobOptBlockData::FindFuturePropertyValue(&pBVar3->globOptData,propertySym);
          }
          if (value == (Value *)0x0) goto LAB_00424f1a;
          bVar6 = ValueInfo::IsFloatConstant(value->valueInfo);
          if (bVar6) {
            pFVar14 = ValueInfo::AsFloatConstant(value->valueInfo);
            bVar6 = Js::JavascriptNumber::IsInt32OrUInt32(pFVar14->floatValue);
          }
          else {
            bVar6 = false;
          }
          bVar7 = ValueType::IsInt(&value->valueInfo->super_ValueType);
          if ((bVar6 | bVar7) == 1) {
            if (this->prePassLoop == (Loop *)0x0) {
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,this_00->m_id);
            }
          }
          else {
            uVar10 = *(uint *)&this->field_0xf4;
            if ((uVar10 >> 9 & 1) == 0) goto LAB_00424f20;
            bVar6 = ValueType::IsLikelyInt(&value->valueInfo->super_ValueType);
            if (!bVar6) goto LAB_00424f1a;
            if (this->prePassLoop == (Loop *)0x0) {
              pSVar15 = GlobOptBlockData::GetCopyPropSym
                                  (&this->currentBlock->globOptData,this_00,value);
              if (pSVar15 == (StackSym *)0x0) {
                if (this_00->m_kind != SymKindStack) {
LAB_00424f1a:
                  uVar10 = *(uint *)&this->field_0xf4;
LAB_00424f20:
                  *(uint *)&this->field_0xf4 = uVar10 | 2;
                  goto LAB_00424f30;
                }
              }
              else {
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,this_00->m_id);
                BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                                   (pSVar15->super_Sym).m_id);
                if (BVar8 != '\0') {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x3753,"(!symsToExclude.Test(copyPropSym->m_id))",
                                     "!symsToExclude.Test(copyPropSym->m_id)");
                  if (!bVar6) goto LAB_00425319;
                  *puVar13 = 0;
                }
                BVar8 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                                   this_00->m_id);
                BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                                   (pSVar15->super_Sym).m_id);
                if ((BVar9 == '\0') &&
                   (BVar9 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                                      ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                                       (pSVar15->super_Sym).m_id), BVar9 == '\0')) {
                  if (BVar8 != '\0') {
                    BVSparse<Memory::JitArenaAllocator>::Set
                              (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                               (pSVar15->super_Sym).m_id);
                  }
                }
                else if (BVar8 == '\0') {
                  BVSparse<Memory::JitArenaAllocator>::Clear
                            (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                             (pSVar15->super_Sym).m_id);
                }
              }
            }
          }
        }
      }
      uVar20 = 0;
      if ((this->field_0xf4 & 2) == 0) {
        if (this->prePassLoop == (Loop *)0x0) {
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                    (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_58);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                    (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_58);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                    (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_98);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                     (this->currentBlock->globOptData).liveInt32Syms,
                     (this->currentBlock->globOptData).liveLossyInt32Syms);
          BVSparse<Memory::JitArenaAllocator>::And
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                     &this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                     (this->currentBlock->globOptData).liveLossyInt32Syms);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_98);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                    (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_58);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                    (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_58);
          BVSparse<Memory::JitArenaAllocator>::Or
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                     (this->currentBlock->globOptData).liveInt32Syms,
                     (this->currentBlock->globOptData).liveFloat64Syms);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                     (this->currentBlock->globOptData).liveVarSyms);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                     &this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                     (BVSparse<Memory::JitArenaAllocator> *)auStack_58);
          bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                            ((BVSparse<Memory::JitArenaAllocator> *)auStack_98);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x37b1,"(deadSymsRequiredToBeInt.IsEmpty())",
                               "deadSymsRequiredToBeInt.IsEmpty()");
            if (!bVar6) goto LAB_00425319;
            *puVar13 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::~BVSparse
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_98);
          BVSparse<Memory::JitArenaAllocator>::~BVSparse
                    ((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
          BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                    (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,
                     &this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
          uVar11 = Func::GetSourceContextId(this->func);
          uVar12 = Func::GetLocalFunctionId(this->func);
          bVar6 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01453738,TrackCompoundedIntOverflowPhase,uVar11,uVar12);
          if (bVar6) {
            pJVar16 = Func::GetJITFunctionBody(this->func);
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
            pcVar18 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&local_f8);
            Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"
                          ,pcVar17,pcVar18,L"Forward",(ulong)this->currentBlock->number);
            Output::Print(L"    Input syms to be int-specialized (lossless): ");
            BVSparse<Memory::JitArenaAllocator>::Dump
                      (&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt);
            Output::Print(L"    Input syms to be converted to int (lossy):   ");
            BVSparse<Memory::JitArenaAllocator>::Dump
                      (&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt);
            Output::Print(L"    First instr: ");
            IR::Instr::Dump(instr->m_next);
            Output::Flush();
          }
          ToInt32(this,&this->intOverflowDoesNotMatterRange->symsRequiredToBeInt,this->currentBlock,
                  false,instr);
          ToInt32(this,&this->intOverflowDoesNotMatterRange->symsRequiredToBeLossyInt,
                  this->currentBlock,true,instr);
          opcode = tempBv1.lastUsedNodePrevNextField._6_2_;
          goto LAB_00425031;
        }
      }
      else {
LAB_00424f30:
        uVar11 = Func::GetSourceContextId(this->func);
        uVar12 = Func::GetLocalFunctionId(this->func);
        bVar6 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01453738,TrackCompoundedIntOverflowPhase,uVar11,uVar12);
        if (bVar6 && this->prePassLoop == (Loop *)0x0) {
          pJVar16 = Func::GetJITFunctionBody(this->func);
          pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
          pcVar18 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&local_f8);
          Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"
                        ,pcVar17,pcVar18,L"Forward",(ulong)this->currentBlock->number);
          Output::Print(L"    Input sym could not be turned into an int:   %u\n",(ulong)uVar20);
          Output::Print(L"    First instr: ");
          IR::Instr::Dump(instr->m_next);
          Output::Flush();
        }
        this->intOverflowDoesNotMatterRange = this->intOverflowDoesNotMatterRange->next;
      }
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_98);
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
      opcode = tempBv1.lastUsedNodePrevNextField._6_2_;
    }
  }
LAB_00425031:
  return opcode == NoIntOverflowBoundary;
}

Assistant:

bool
GlobOpt::PrepareForIgnoringIntOverflow(IR::Instr *const instr)
{
    Assert(instr);

    const bool isBoundary = instr->m_opcode == Js::OpCode::NoIntOverflowBoundary;

    // Update the instruction's "int overflow matters" flag based on whether we are currently allowing ignoring int overflows.
    // Some operations convert their srcs to int32s, those can still ignore int overflow.
    if(instr->ignoreIntOverflowInRange)
    {
        instr->ignoreIntOverflowInRange = !intOverflowCurrentlyMattersInRange || OpCodeAttr::IsInt32(instr->m_opcode);
    }

    if(!intOverflowDoesNotMatterRange)
    {
        Assert(intOverflowCurrentlyMattersInRange);

        // There are no more ranges of instructions where int overflow does not matter, in this block.
        return isBoundary;
    }

    if(instr == intOverflowDoesNotMatterRange->LastInstr())
    {
        Assert(isBoundary);

        // Reached the last instruction in the range
        intOverflowCurrentlyMattersInRange = true;
        intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
        return isBoundary;
    }

    if(!intOverflowCurrentlyMattersInRange)
    {
        return isBoundary;
    }

    if(instr != intOverflowDoesNotMatterRange->FirstInstr())
    {
        // Have not reached the next range
        return isBoundary;
    }

    Assert(isBoundary);

    // This is the first instruction in a range of instructions where int overflow does not matter. There can be many inputs to
    // instructions in the range, some of which are inputs to the range itself (that is, the values are not defined in the
    // range). Ignoring int overflow is only valid for int operations, so we need to ensure that all inputs to the range are
    // int (not "likely int") before ignoring any overflows in the range. Ensuring that a sym with a "likely int" value is an
    // int requires a bail-out. These bail-out check need to happen before any overflows are ignored, otherwise it's too late.
    // The backward pass tracked all inputs into the range. Iterate over them and verify the values, and insert lossless
    // conversions to int as necessary, before the first instruction in the range. If for any reason all values cannot be
    // guaranteed to be ints, the optimization will be disabled for this range.
    intOverflowCurrentlyMattersInRange = false;
    {
        BVSparse<JitArenaAllocator> tempBv1(tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(tempAlloc);

        {
            // Just renaming the temp BVs for this section to indicate how they're used so that it makes sense
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &symsToInclude = tempBv2;
#if DBG_DUMP
            SymID couldNotConvertSymId = 0;
#endif
            FOREACH_BITSET_IN_SPARSEBV(id, intOverflowDoesNotMatterRange->SymsRequiredToBeInt())
            {
                Sym *const sym = func->m_symTable->Find(id);
                Assert(sym);

                // Some instructions with property syms are also tracked by the backward pass, and may be included in the range
                // (LdSlot for instance). These property syms don't get their values until either copy-prop resolves a value for
                // them, or a new value is created once the use of the property sym is reached. In either case, we're not that
                // far yet, so we need to find the future value of the property sym by evaluating copy-prop in reverse.
                Value *const value = sym->IsStackSym() ? CurrentBlockData()->FindValue(sym) : CurrentBlockData()->FindFuturePropertyValue(sym->AsPropertySym());
                if(!value)
                {
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                const bool isInt32OrUInt32Float =
                    value->GetValueInfo()->IsFloatConstant() &&
                    Js::JavascriptNumber::IsInt32OrUInt32(value->GetValueInfo()->AsFloatConstant()->FloatValue());
                if(value->GetValueInfo()->IsInt() || isInt32OrUInt32Float)
                {
                    if(!IsLoopPrePass())
                    {
                        // Input values that are already int can be excluded from int-specialization. We can treat unsigned
                        // int32 values as int32 values (ignoring the overflow), since the values will only be used inside the
                        // range where overflow does not matter.
                        symsToExclude.Set(sym->m_id);
                    }
                    continue;
                }

                if(!DoAggressiveIntTypeSpec() || !value->GetValueInfo()->IsLikelyInt())
                {
                    // When aggressive int specialization is off, syms with "likely int" values cannot be forced to int since
                    // int bail-out checks are not allowed in that mode. Similarly, with aggressive int specialization on, it
                    // wouldn't make sense to force non-"likely int" values to int since it would almost guarantee a bail-out at
                    // runtime. In both cases, just disable ignoring overflow for this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }

                if(IsLoopPrePass())
                {
                    // The loop prepass does not modify bit-vectors. Since it doesn't add bail-out checks, it also does not need
                    // to specialize anything up-front. It only needs to be consistent in how it determines whether to allow
                    // ignoring overflow for a range, based on the values of inputs into the range.
                    continue;
                }

                // Since input syms are tracked in the backward pass, where there is no value tracking, it will not be aware of
                // copy-prop. If a copy-prop sym is available, it will be used instead, so exclude the original sym and include
                // the copy-prop sym for specialization.
                StackSym *const copyPropSym = CurrentBlockData()->GetCopyPropSym(sym, value);
                if(copyPropSym)
                {
                    symsToExclude.Set(sym->m_id);
                    Assert(!symsToExclude.Test(copyPropSym->m_id));

                    const bool needsToBeLossless =
                        !intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Test(sym->m_id);
                    if(intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Test(copyPropSym->m_id) ||
                        symsToInclude.TestAndSet(copyPropSym->m_id))
                    {
                        // The copy-prop sym is already included
                        if(needsToBeLossless)
                        {
                            // The original sym needs to be lossless, so make the copy-prop sym lossless as well.
                            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Clear(copyPropSym->m_id);
                        }
                    }
                    else if(!needsToBeLossless)
                    {
                        // The copy-prop sym was not included before, and the original sym can be lossy, so make it lossy.
                        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Set(copyPropSym->m_id);
                    }
                }
                else if(!sym->IsStackSym())
                {
                    // Only stack syms can be converted to int, and copy-prop syms are stack syms. If a copy-prop sym was not
                    // found for the property sym, we can't ignore overflows in this range.
#if DBG_DUMP
                    couldNotConvertSymId = id;
#endif
                    intOverflowCurrentlyMattersInRange = true;
                    BREAK_BITSET_IN_SPARSEBV;
                }
            } NEXT_BITSET_IN_SPARSEBV;

            if(intOverflowCurrentlyMattersInRange)
            {
#if DBG_DUMP
                if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func) && !IsLoopPrePass())
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(
                        _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u, Disabled ignoring overflows\n"),
                        func->GetJITFunctionBody()->GetDisplayName(),
                        func->GetDebugNumberSet(debugStringBuffer),
                        Js::PhaseNames[Js::ForwardPhase],
                        currentBlock->GetBlockNum());
                    Output::Print(_u("    Input sym could not be turned into an int:   %u\n"), couldNotConvertSymId);
                    Output::Print(_u("    First instr: "));
                    instr->m_next->Dump();
                    Output::Flush();
                }
#endif
                intOverflowDoesNotMatterRange = intOverflowDoesNotMatterRange->Next();
                return isBoundary;
            }

            if(IsLoopPrePass())
            {
                return isBoundary;
            }

            // Update the syms to specialize after enumeration
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Or(&symsToInclude);
        }

        {
            // Exclude syms that are already live as lossless int32, and exclude lossy conversions of syms that are already live
            // as lossy int32.
            //     symsToExclude = liveInt32Syms - liveLossyInt32Syms                   // syms live as lossless int
            //     lossySymsToExclude = symsRequiredToBeLossyInt & liveLossyInt32Syms;  // syms we want as lossy int that are already live as lossy int
            //     symsToExclude |= lossySymsToExclude
            //     symsRequiredToBeInt -= symsToExclude
            //     symsRequiredToBeLossyInt -= symsToExclude
            BVSparse<JitArenaAllocator> &symsToExclude = tempBv1;
            BVSparse<JitArenaAllocator> &lossySymsToExclude = tempBv2;
            symsToExclude.Minus(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveLossyInt32Syms);
            lossySymsToExclude.And(
                intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(),
                CurrentBlockData()->liveLossyInt32Syms);
            symsToExclude.Or(&lossySymsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(&symsToExclude);
            intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Minus(&symsToExclude);
        }

#if DBG
        {
            // Verify that the syms to be converted are live
            //     liveSyms = liveInt32Syms | liveFloat64Syms | liveVarSyms
            //     deadSymsRequiredToBeInt = symsRequiredToBeInt - liveSyms
            BVSparse<JitArenaAllocator> &liveSyms = tempBv1;
            BVSparse<JitArenaAllocator> &deadSymsRequiredToBeInt = tempBv2;
            liveSyms.Or(CurrentBlockData()->liveInt32Syms, CurrentBlockData()->liveFloat64Syms);
            liveSyms.Or(CurrentBlockData()->liveVarSyms);
            deadSymsRequiredToBeInt.Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), &liveSyms);
            Assert(deadSymsRequiredToBeInt.IsEmpty());
        }
#endif
    }

    // Int-specialize the syms before the first instruction of the range (the current instruction)
    intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Minus(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt());

#if DBG_DUMP
    if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"),
            func->GetJITFunctionBody()->GetDisplayName(),
            func->GetDebugNumberSet(debugStringBuffer),
            Js::PhaseNames[Js::ForwardPhase],
            currentBlock->GetBlockNum());
        Output::Print(_u("    Input syms to be int-specialized (lossless): "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeInt()->Dump();
        Output::Print(_u("    Input syms to be converted to int (lossy):   "));
        intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Dump();
        Output::Print(_u("    First instr: "));
        instr->m_next->Dump();
        Output::Flush();
    }
#endif

    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeInt(), currentBlock, false /* lossy */, instr);
    ToInt32(intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt(), currentBlock, true /* lossy */, instr);
    return isBoundary;
}